

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputTextMessageContent.h
# Opt level: O0

void __thiscall
TgBot::InputTextMessageContent::InputTextMessageContent(InputTextMessageContent *this)

{
  allocator local_31;
  string local_30;
  InputTextMessageContent *local_10;
  InputTextMessageContent *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"InputTextMessageContent",&local_31);
  InputMessageContent::InputMessageContent(&this->super_InputMessageContent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputTextMessageContent_0051b860;
  std::__cxx11::string::string((string *)&this->messageText);
  std::__cxx11::string::string((string *)&this->parseMode);
  return;
}

Assistant:

InputTextMessageContent():
        InputMessageContent("InputTextMessageContent")
    {}